

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_charAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValue JVar2;
  JSValue JVar3;
  int c;
  int idx;
  JSString *p;
  JSValue ret;
  JSValue val;
  undefined1 in_stack_ffffffffffffff68 [16];
  JSContext *ctx_00;
  JSValue in_stack_ffffffffffffff78;
  JSValueUnion JVar4;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  JSValueUnion local_58;
  JSContext *local_50;
  int32_t local_10;
  undefined4 uStack_c;
  JSContext *local_8;
  
  ctx_00 = in_stack_ffffffffffffff68._8_8_;
  JVar2 = JS_ToStringCheckObject(ctx_00,in_stack_ffffffffffffff78);
  JVar4 = JVar2.u;
  local_8 = (JSContext *)JVar2.tag;
  JVar3 = JVar2;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JVar2.u._4_4_ = in_stack_ffffffffffffff9c;
    JVar2.u.int32 = in_stack_ffffffffffffff98;
    JVar2.tag = (int64_t)JVar4.ptr;
    iVar1 = JS_ToInt32Sat((JSContext *)JVar3.tag,(int *)JVar3.u.ptr,JVar2);
    if (iVar1 == 0) {
      if ((in_stack_ffffffffffffff9c < 0) ||
         ((int)((uint)*(undefined8 *)((long)JVar4.ptr + 4) & 0x7fffffff) <=
          in_stack_ffffffffffffff9c)) {
        in_stack_ffffffffffffff78 =
             js_new_string8((JSContext *)in_stack_ffffffffffffff78.tag,
                            (uint8_t *)in_stack_ffffffffffffff78.u.ptr,
                            in_stack_ffffffffffffff68._12_4_);
        local_58 = in_stack_ffffffffffffff78.u;
        local_50 = (JSContext *)in_stack_ffffffffffffff78.tag;
      }
      else {
        JVar3 = js_new_string_char(ctx_00,in_stack_ffffffffffffff68._6_2_);
        local_58 = JVar3.u;
        local_50 = (JSContext *)JVar3.tag;
        ctx_00 = local_50;
      }
      JS_FreeValue(ctx_00,in_stack_ffffffffffffff78);
      local_10 = local_58.int32;
      uStack_c = local_58._4_4_;
      local_8 = local_50;
    }
    else {
      JS_FreeValue(ctx_00,in_stack_ffffffffffffff78);
      local_10 = 0;
      local_8 = (JSContext *)0x6;
    }
  }
  else {
    local_10 = JVar2.u._0_4_;
    uStack_c = JVar2.u._4_4_;
  }
  JVar3.u._4_4_ = uStack_c;
  JVar3.u.int32 = local_10;
  JVar3.tag = (int64_t)local_8;
  return JVar3;
}

Assistant:

static JSValue js_string_charAt(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = js_new_string8(ctx, NULL, 0);
    } else {
        if (p->is_wide_char)
            c = p->u.str16[idx];
        else
            c = p->u.str8[idx];
        ret = js_new_string_char(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}